

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QList<QTimeZonePrivate::Data> * __thiscall
QTzTimeZonePrivate::getPosixTransitions(QTzTimeZonePrivate *this,qint64 msNear)

{
  long lVar1;
  bool bVar2;
  QTzTimeZonePrivate *in_RSI;
  QList<QTimeZonePrivate::Data> *in_RDI;
  long in_FS_OFFSET;
  qint64 atTime;
  int year;
  qint64 in_stack_000001f0;
  int in_stack_000001f8;
  int in_stack_000001fc;
  Initialization in_stack_ffffffffffffff5c;
  QTimeZone *in_stack_ffffffffffffff60;
  QList<QTzTransitionTime> *in_stack_ffffffffffffff68;
  QList<QTimeZonePrivate::Data> *msecs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msecs = in_RDI;
  QTimeZone::QTimeZone(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  QDateTime::fromMSecsSinceEpoch((qint64)msecs,(QTimeZone *)in_RDI);
  QDateTime::date((QDateTime *)in_stack_ffffffffffffff68);
  QDate::year((QDate *)in_stack_ffffffffffffff60);
  QDateTime::~QDateTime((QDateTime *)0x74d7b0);
  QTimeZone::~QTimeZone((QTimeZone *)0x74d7bd);
  tranCache(in_RSI);
  bVar2 = QList<QTzTransitionTime>::isEmpty((QList<QTzTransitionTime> *)0x74d7d7);
  if (!bVar2) {
    tranCache(in_RSI);
    QList<QTzTransitionTime>::last(in_stack_ffffffffffffff68);
  }
  calculatePosixTransitions
            ((QByteArray *)msNear,in_stack_000001fc,in_stack_000001f8,in_stack_000001f0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return msecs;
}

Assistant:

QList<QTimeZonePrivate::Data> QTzTimeZonePrivate::getPosixTransitions(qint64 msNear) const
{
    const int year = QDateTime::fromMSecsSinceEpoch(msNear, QTimeZone::UTC).date().year();
    // The Data::atMSecsSinceEpoch of the single entry if zone is constant:
    qint64 atTime = tranCache().isEmpty() ? msNear : tranCache().last().atMSecsSinceEpoch;
    return calculatePosixTransitions(cached_data.m_posixRule, year - 1, year + 1, atTime);
}